

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O3

void __thiscall
Indexing::SubstitutionTree<Indexing::LiteralClause>::FastInstancesIterator::init<Kernel::Literal*>
          (FastInstancesIterator *this,SubstitutionTree<Indexing::LiteralClause> *parent,Node *root,
          Literal *query,bool retrieveSubstitution,bool reversed)

{
  int *piVar1;
  DHMap<Kernel::TermList,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *this_00;
  int iVar2;
  IteratorCore<Indexing::LiteralClause_*> *in_RAX;
  VirtualIterator<Indexing::LiteralClause_*> local_38;
  
  this->_retrieveSubstitution = retrieveSubstitution;
  local_38._core = in_RAX;
  iVar2 = (*root->_vptr_Node[2])(root);
  this->_inLeaf = SUB41(iVar2,0);
  if (SUB41(iVar2,0) == false) {
    Lib::VirtualIterator<Indexing::LiteralClause_*>::getEmpty();
  }
  else {
    (*root->_vptr_Node[8])(&local_38,root);
  }
  Lib::VirtualIterator<Indexing::LiteralClause_*>::operator=(&this->_ldIterator,&local_38);
  if (local_38._core != (IteratorCore<Indexing::LiteralClause_*> *)0x0) {
    piVar1 = &(local_38._core)->_refCnt;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      (*(local_38._core)->_vptr_IteratorCore[1])();
    }
  }
  this->_root = root;
  (this->_subst)._boundVars._cursor = (this->_subst)._boundVars._stack;
  Lib::
  DHMap<Kernel::TermList,_Indexing::SubstitutionTree<Indexing::LiteralClause>::InstMatcher::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>
  ::reset(&(this->_subst)._bindings);
  this_00 = &(this->_subst)._derefBindings;
  Lib::DHMap<Kernel::TermList,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::reset
            (this_00);
  createBindings<Indexing::SubstitutionTree<Indexing::LiteralClause>::FastInstancesIterator::init<Kernel::Literal*>(Indexing::SubstitutionTree<Indexing::LiteralClause>*,Indexing::SubstitutionTree<Indexing::LiteralClause>::Node*,Kernel::Literal*,bool,bool)::_lambda(unsigned_int,Kernel::TermList)_1_>
            (parent,query,reversed,(anon_class_8_1_8991fb9c)this);
  if (this->_inLeaf == true) {
    Lib::DHMap<Kernel::TermList,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::reset
              (this_00);
  }
  return;
}

Assistant:

void init(SubstitutionTree* parent, Node* root, TermOrLit query, bool retrieveSubstitution, bool reversed) {
        _retrieveSubstitution = retrieveSubstitution;
        _inLeaf = root->isLeaf();
        _ldIterator = _inLeaf ? static_cast<Leaf*>(root)->allChildren() : LDIterator::getEmpty();
        _root = root;
        _iterCntr = parent->_iterCnt;
        _subst.reset();

        ASS(root);

        parent->createBindings(query, reversed,
            [&](unsigned var, TermList t) { _subst.bindSpecialVar(var, t); });

        if (_inLeaf) {
          _subst.onLeafEntered(); //we reset the bindings cache
        }
      }